

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifMan.c
# Opt level: O2

void If_ManSetupCutTriv(If_Man_t *p,If_Cut_t *pCut,int ObjId)

{
  If_Par_t *pIVar1;
  uint uVar2;
  float fVar3;
  
  uVar2 = *(uint *)&pCut->field_0x1c;
  *(uint *)&pCut->field_0x1c = uVar2 & 0xffffefff;
  *(uint *)&pCut->field_0x1c = (uVar2 & 0xefff) + (p->pPars->nLutSize & 0xffU) * 0x10000 + 0x1000000
  ;
  pIVar1 = p->pPars;
  fVar3 = (float)(ObjId << 8);
  if (pIVar1->fLiftLeaves == 0) {
    fVar3 = (float)ObjId;
  }
  pCut[1].Area = fVar3;
  pCut->uSign = 1 << (sbyte)((ulong)(uint)fVar3 % 0x1f);
  if (pIVar1->fUseTtPerm == 0) {
    uVar2 = -(uint)(pIVar1->fTruth == 0) | 2;
  }
  else {
    uVar2 = 3;
  }
  pCut->iCutFunc = uVar2;
  pCut->uMaskFunc = 0;
  if ((int)fVar3 < p->vObjs->nSize) {
    return;
  }
  __assert_fail("pCut->pLeaves[0] < p->vObjs->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifMan.c"
                ,0x20c,"void If_ManSetupCutTriv(If_Man_t *, If_Cut_t *, int)");
}

Assistant:

void If_ManSetupCutTriv( If_Man_t * p, If_Cut_t * pCut, int ObjId )
{
    pCut->fCompl     = 0;
    pCut->nLimit     = p->pPars->nLutSize;
    pCut->nLeaves    = 1;
    pCut->pLeaves[0] = p->pPars->fLiftLeaves? (ObjId << 8) : ObjId;
    pCut->uSign      = If_ObjCutSign( pCut->pLeaves[0] );
    pCut->iCutFunc   = p->pPars->fUseTtPerm ? 3 : (p->pPars->fTruth ? 2: -1);
    pCut->uMaskFunc  = 0;
    assert( pCut->pLeaves[0] < p->vObjs->nSize );
}